

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtperrors.cpp
# Opt level: O0

string * __thiscall
jrtplib::RTPGetErrorString_abi_cxx11_(string *__return_storage_ptr__,jrtplib *this,int errcode)

{
  char *__s;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char local_48 [8];
  char str [16];
  allocator<char> local_2d [20];
  allocator<char> local_19;
  int local_18;
  int local_14;
  int i;
  int errcode_local;
  
  local_14 = (int)this;
  _i = __return_storage_ptr__;
  if (local_14 < 0) {
    local_18 = 0;
    while (*(int *)(ErrorDescriptions + (long)local_18 * 0x10) != 0) {
      if (*(int *)(ErrorDescriptions + (long)local_18 * 0x10) == local_14) {
        __s = *(char **)(ErrorDescriptions + (long)local_18 * 0x10 + 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,__s,local_2d);
        std::allocator<char>::~allocator(local_2d);
        return __return_storage_ptr__;
      }
      local_18 = local_18 + 1;
    }
    snprintf(local_48,0x10,"(%d)",(ulong)this & 0xffffffff);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Unknown error code",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,local_48,&local_91);
    std::operator+(__return_storage_ptr__,&local_68,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"No error",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RTPGetErrorString(int errcode)
{
	int i;
	
	if (errcode >= 0)
		return std::string("No error");
	
	i = 0;
	while (ErrorDescriptions[i].code != 0)
	{
		if (ErrorDescriptions[i].code == errcode)
			return std::string(ErrorDescriptions[i].description);
		i++;
	}

	char str[16];
	
	RTP_SNPRINTF(str,16,"(%d)",errcode);
	
	return std::string("Unknown error code") + std::string(str);
}